

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O3

void deqp::WriteField(TestLog *log,char *title,string *message)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  string line;
  istringstream tokens;
  char *local_1c0;
  undefined8 local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  long local_1a0 [15];
  ios_base local_128 [264];
  
  iVar2 = std::__cxx11::string::compare((char *)message);
  if (iVar2 != 0) {
    std::__cxx11::istringstream::istringstream((istringstream *)local_1a0,(string *)message,_S_in);
    local_1b8 = 0;
    local_1b0 = '\0';
    local_1c0 = &local_1b0;
    tcu::TestLog::startSection(log,"Details",title);
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_1a0[0] + -0x18) +
                              (char)(istringstream *)local_1a0);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1a0,(string *)&local_1c0,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      tcu::TestLog::writeMessage(log,local_1c0);
    }
    tcu::TestLog::endSection(log);
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

void WriteField(tcu::TestLog& log, const char* title, std::string message)
{
	if (message == "")
		return;
	using namespace std;
	using tcu::TestLog;
	istringstream tokens(message);
	string		  line;
	log.startSection("Details", title);
	while (getline(tokens, line))
	{
		log.writeMessage(line.c_str());
	}
	log.endSection();
}